

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O0

void __thiscall CCountryFlags::LoadCountryflagsIndexfile(CCountryFlags *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IStorage *pIVar4;
  undefined4 extraout_var;
  IConsole *pIVar5;
  json_value *pjVar6;
  _json_value *p_Var7;
  _json_value *p_Var8;
  ulong uVar9;
  char *pcVar10;
  CConfig *pCVar11;
  IGraphics *pIVar12;
  CCountryFlag *pCVar13;
  sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_> *in_RDI
  ;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  int Index;
  int DefaultIndex;
  char *pCountryName;
  int CountryCode;
  uint i;
  json_value *rStart;
  int Index_1;
  json_value *rInit;
  json_value *pJsonData;
  char *pFileData;
  int FileSize;
  IOHANDLE File;
  char *pFilename;
  range r;
  json_value Check;
  CImageInfo Info;
  json_settings JsonSettings;
  char aMsg [64];
  CCountryFlag CountryFlag;
  char aBuf [64];
  char *paIndices [2];
  char aError [256];
  json_value *value;
  uint size;
  plain_range<CCountryFlags::CCountryFlag> *this_00;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  uint local_28c;
  int local_27c;
  plain_range<CCountryFlags::CCountryFlag> local_240;
  undefined1 local_230 [8];
  json_type local_228;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  undefined8 local_1f0;
  char local_1b8 [76];
  int local_16c;
  undefined1 local_160;
  int local_15c;
  char local_158 [64];
  char *local_118;
  char *local_110;
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar4 = CComponent::Storage((CComponent *)0x159fc2);
  value = (json_value *)0x0;
  this_00 = (plain_range<CCountryFlags::CCountryFlag> *)0x0;
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[4])
                    (pIVar4,"countryflags/index.json",1,0xffffffff,0,0);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    pIVar5 = CComponent::Console((CComponent *)0x15a008);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
              (pIVar5,1,"countryflags","couldn\'t open index file",0);
  }
  else {
    io_length((IOHANDLE)this_00);
    mem_alloc(0);
    io_read((IOHANDLE)this_00,value,0);
    io_close((IOHANDLE)0x15a068);
    mem_zero(this_00,(uint)((ulong)value >> 0x20));
    pjVar6 = json_parse_ex((json_settings *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           (char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    mem_free((void *)0x15a0a8);
    if (pjVar6 == (json_value *)0x0) {
      pIVar5 = CComponent::Console((CComponent *)0x15a0ba);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                (pIVar5,1,"countryflags/index.json",local_108,0);
    }
    else {
      p_Var7 = _json_value::operator[]
                         ((_json_value *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          (char *)this_00);
      if (p_Var7->type == json_object) {
        local_118 = "custom";
        local_110 = "ISO 3166-1";
        for (local_27c = 0; local_27c < 2; local_27c = local_27c + 1) {
          p_Var7 = _json_value::operator[]
                             ((_json_value *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                              (char *)this_00);
          if (p_Var7->type == json_array) {
            for (local_28c = 0; local_28c < (p_Var7->u).string.length; local_28c = local_28c + 1) {
              _json_value::operator[](p_Var7,local_28c);
              p_Var8 = _json_value::operator[]
                                 ((_json_value *)
                                  CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                  (char *)this_00);
              uVar9 = _json_value::operator_cast_to_long(p_Var8);
              iVar2 = (int)uVar9;
              if ((iVar2 < -1) || (999 < iVar2)) {
                str_format(local_158,0x40,"country code \'%i\' not within valid code range [%i..%i]"
                           ,uVar9 & 0xffffffff,0xffffffff,999);
                pIVar5 = CComponent::Console((CComponent *)0x15a1ea);
                (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                          (pIVar5,1,"countryflags",local_158);
              }
              else {
                _json_value::operator[](p_Var7,local_28c);
                p_Var8 = _json_value::operator[]
                                   ((_json_value *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    (char *)this_00);
                pcVar10 = _json_value::operator_cast_to_char_(p_Var8);
                CCountryFlag::CCountryFlag((CCountryFlag *)0x15a249);
                local_16c = iVar2;
                str_copy((char *)this_00,(char *)value,0);
                pCVar11 = CComponent::Config((CComponent *)0x15a279);
                if (pCVar11->m_ClLoadCountryFlags != 0) {
                  str_format(local_158,0x40,"countryflags/%s.png",pcVar10);
                  pIVar12 = CComponent::Graphics((CComponent *)0x15a2b0);
                  iVar2 = (*(pIVar12->super_IInterface)._vptr_IInterface[0xe])
                                    (pIVar12,&local_200,local_158,0xffffffff);
                  if (iVar2 == 0) {
                    str_format(local_1b8,0x40,"failed to load \'%s\'",local_158);
                    pIVar5 = CComponent::Console((CComponent *)0x15a300);
                    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                              (pIVar5,1,"countryflags",local_1b8);
                    goto LAB_0015a466;
                  }
                  pIVar12 = CComponent::Graphics((CComponent *)0x15a332);
                  value = (json_value *)((ulong)value & 0xffffffff00000000);
                  local_15c = (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                                        (pIVar12,(ulong)local_200,(ulong)local_1fc,(ulong)local_1f8,
                                         local_1f0,(ulong)local_1f8);
                  mem_free((void *)0x15a38f);
                }
                local_160 = 0;
                _json_value::operator[](p_Var7,local_28c);
                p_Var8 = _json_value::operator[]
                                   ((_json_value *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    (char *)this_00);
                memcpy(local_230,p_Var8,0x28);
                if ((local_228 == json_boolean) &&
                   (bVar1 = _json_value::operator_cast_to_bool((_json_value *)local_230), bVar1)) {
                  local_160 = 1;
                }
                sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                ::add_unsorted((sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                                *)this_00,(CCountryFlag *)value);
                pCVar11 = CComponent::Config((CComponent *)0x15a40e);
                if (pCVar11->m_Debug != 0) {
                  str_format(local_158,0x40,"loaded country flag \'%s\'",pcVar10);
                  pIVar5 = CComponent::Console((CComponent *)0x15a441);
                  (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                            (pIVar5,1,"countryflags",local_158,0);
                }
              }
LAB_0015a466:
            }
          }
        }
      }
      json_value_free(value);
      sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::
      sort_range(in_RDI);
      local_29c = 0;
      local_2a0 = 0;
      local_240 = (plain_range<CCountryFlags::CCountryFlag>)
                  sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  ::all((sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                         *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      while( true ) {
        bVar1 = plain_range<CCountryFlags::CCountryFlag>::empty(&local_240);
        size = (uint)((ulong)value >> 0x20);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pCVar13 = plain_range<CCountryFlags::CCountryFlag>::front(this_00);
        size = (uint)((ulong)value >> 0x20);
        if (pCVar13->m_CountryCode == -1) {
          local_29c = local_2a0;
          break;
        }
        plain_range<CCountryFlags::CCountryFlag>::pop_front(this_00);
        local_2a0 = local_2a0 + 1;
      }
      if (local_29c == 0) {
        mem_zero(this_00,size);
      }
      else {
        for (local_2a4 = 0; local_2a4 < 0x3e9; local_2a4 = local_2a4 + 1) {
          *(int *)((long)&in_RDI[2].
                          super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                          .list + (long)local_2a4 * 4) = local_29c;
        }
      }
      local_2a8 = 0;
      while (iVar2 = local_2a8,
            iVar3 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    ::size(&in_RDI[1].
                            super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                          ), iVar2 < iVar3) {
        iVar2 = local_2a8;
        pCVar13 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  ::operator[](&in_RDI[1].
                                super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                               ,local_2a8);
        iVar3 = maximum<int>(0,(pCVar13->m_CountryCode + 1) % 0x3e9);
        *(int *)((long)&in_RDI[2].
                        super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                        .list + (long)iVar3 * 4) = iVar2;
        local_2a8 = local_2a8 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCountryFlags::LoadCountryflagsIndexfile()
{
	// read file data into buffer
	const char *pFilename = "countryflags/index.json";
	IOHANDLE File = Storage()->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", "couldn't open index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract data
	const json_value &rInit = (*pJsonData)["country codes"];
	if(rInit.type == json_object)
	{
		enum
		{
			NUM_INDICES = 2,
		};
		const char *paIndices[NUM_INDICES] = {"custom", "ISO 3166-1"};
		for(int Index = 0; Index < NUM_INDICES; ++Index)
		{
			const json_value &rStart = rInit[(const char *)paIndices[Index]];
			if(rStart.type == json_array)
			{
				for(unsigned i = 0; i < rStart.u.array.length; ++i)
				{
					char aBuf[64];

					// validate country code
					int CountryCode = (json_int_t)rStart[i]["code"];
					if(CountryCode < CODE_LB || CountryCode > CODE_UB)
					{
						str_format(aBuf, sizeof(aBuf), "country code '%i' not within valid code range [%i..%i]", CountryCode, CODE_LB, CODE_UB);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
						continue;
					}

					// add entry
					const char *pCountryName = rStart[i]["id"];
					CCountryFlag CountryFlag;
					CountryFlag.m_CountryCode = CountryCode;
					str_copy(CountryFlag.m_aCountryCodeString, pCountryName, sizeof(CountryFlag.m_aCountryCodeString));
					if(Config()->m_ClLoadCountryFlags)
					{
						// load the graphic file
						CImageInfo Info;
						str_format(aBuf, sizeof(aBuf), "countryflags/%s.png", pCountryName);
						if(!Graphics()->LoadPNG(&Info, aBuf, IStorage::TYPE_ALL))
						{
							char aMsg[64];
							str_format(aMsg, sizeof(aMsg), "failed to load '%s'", aBuf);
							Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aMsg);
							continue;
						}
						CountryFlag.m_Texture = Graphics()->LoadTextureRaw(Info.m_Width, Info.m_Height, Info.m_Format, Info.m_pData, Info.m_Format, 0);
						mem_free(Info.m_pData);
					}
					// blocked?
					CountryFlag.m_Blocked = false;
					const json_value Check = rStart[i]["blocked"];
					if(Check.type == json_boolean && Check)
						CountryFlag.m_Blocked = true;
					m_aCountryFlags.add_unsorted(CountryFlag);

					// print message
					if(Config()->m_Debug)
					{
						str_format(aBuf, sizeof(aBuf), "loaded country flag '%s'", pCountryName);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
					}
				}
			}
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_aCountryFlags.sort_range();

	// find index of default item
	int DefaultIndex = 0, Index = 0;
	for(sorted_array<CCountryFlag>::range r = m_aCountryFlags.all(); !r.empty(); r.pop_front(), ++Index)
		if(r.front().m_CountryCode == -1)
		{
			DefaultIndex = Index;
			break;
		}

	// init LUT
	if(DefaultIndex != 0)
		for(int i = 0; i < CODE_RANGE; ++i)
			m_CodeIndexLUT[i] = DefaultIndex;
	else
		mem_zero(m_CodeIndexLUT, sizeof(m_CodeIndexLUT));
	for(int i = 0; i < m_aCountryFlags.size(); ++i)
		m_CodeIndexLUT[maximum(0, (m_aCountryFlags[i].m_CountryCode-CODE_LB)%CODE_RANGE)] = i;
}